

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_metric.c
# Opt level: O2

REF_STATUS ref_metric_truncated_cone_dist(REF_DBL *cone_geom,REF_DBL *p,REF_DBL *dist)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  uint uVar3;
  long lVar4;
  double dVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  REF_DBL RVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  undefined1 auVar12 [16];
  double dVar13;
  undefined1 auVar14 [16];
  double dVar15;
  double dVar16;
  REF_DBL u [3];
  REF_DBL pa [3];
  REF_DBL ba [3];
  REF_DBL b [3];
  REF_DBL a [3];
  
  auVar12 = *(undefined1 (*) [16])(cone_geom + 6);
  auVar7._0_8_ = auVar12._0_8_ ^ 0x8000000000000000;
  auVar7._8_8_ = auVar12._8_8_ ^ 0x8000000000000000;
  auVar12 = maxpd(auVar12,auVar7);
  dVar16 = auVar12._8_8_;
  lVar4 = 0;
  if (dVar16 <= auVar12._0_8_) {
    for (; lVar4 != 3; lVar4 = lVar4 + 1) {
      a[lVar4] = cone_geom[lVar4];
      b[lVar4] = cone_geom[lVar4 + 3];
    }
    auVar12._8_8_ = auVar12._0_8_;
    auVar12._0_8_ = dVar16;
  }
  else {
    for (; lVar4 != 3; lVar4 = lVar4 + 1) {
      a[lVar4] = cone_geom[lVar4 + 3];
      b[lVar4] = cone_geom[lVar4];
    }
  }
  dVar16 = auVar12._8_8_;
  for (lVar4 = 0; lVar4 != 0x18; lVar4 = lVar4 + 8) {
    dVar5 = *(double *)((long)b + lVar4) - *(double *)((long)a + lVar4);
    *(double *)((long)ba + lVar4) = dVar5;
    *(double *)((long)u + lVar4) = dVar5;
    *(double *)((long)pa + lVar4) = *(double *)((long)p + lVar4) - *(double *)((long)a + lVar4);
  }
  dVar13 = SQRT(ba[2] * ba[2] + ba[0] * ba[0] + ba[1] * ba[1]);
  auVar6._0_8_ = dVar13 * 1e+20;
  auVar6._8_8_ = u[0];
  auVar1._8_8_ = -u[0];
  auVar1._0_8_ = -auVar6._0_8_;
  auVar7 = maxpd(auVar6,auVar1);
  dVar5 = auVar7._0_8_;
  dVar9 = auVar12._0_8_;
  if (dVar5 <= auVar7._8_8_) {
LAB_001d5859:
    if (dVar16 <= dVar9) {
      dVar16 = dVar9;
    }
    dVar16 = SQRT(pa[2] * pa[2] + pa[0] * pa[0] + pa[1] * pa[1]) - dVar16;
    RVar8 = 0.0;
    if (0.0 <= dVar16) {
      RVar8 = dVar16;
    }
    *dist = RVar8;
    return 0;
  }
  RVar8 = u[1];
  if (u[1] <= -u[1]) {
    RVar8 = -u[1];
  }
  if (dVar5 <= RVar8) goto LAB_001d5859;
  RVar8 = u[2];
  if (u[2] <= -u[2]) {
    RVar8 = -u[2];
  }
  if (dVar5 <= RVar8) goto LAB_001d5859;
  uVar3 = ref_math_normalize(u);
  if (uVar3 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",0xcc3,
           "ref_metric_truncated_cone_dist",(ulong)uVar3,"axis length zero");
    ref_metric_tattle_truncated_cone_dist(cone_geom,p);
    return uVar3;
  }
  dVar15 = u[2] * pa[2] + u[0] * pa[0] + u[1] * pa[1];
  dVar5 = SQRT(pa[2] * pa[2] + pa[0] * pa[0] + pa[1] * pa[1]);
  dVar10 = dVar5 * dVar5 - dVar15 * dVar15;
  dVar5 = 0.0;
  if (0.0 < dVar10) {
    if (dVar10 < 0.0) {
      dVar5 = sqrt(dVar10);
    }
    else {
      dVar5 = SQRT(dVar10);
    }
  }
  if (0.0 <= dVar15) {
    if (dVar10 < dVar9 * dVar9) {
      if (dVar13 < dVar15) {
        *dist = dVar15 - dVar13;
        return 0;
      }
      *dist = 0.0;
      return 0;
    }
    dVar9 = dVar16 - dVar9;
    dVar10 = SQRT(dVar13 * dVar13 + dVar9 * dVar9);
    auVar14._0_8_ = dVar10 * 1e+20;
    auVar14._8_8_ = dVar9;
    auVar2._8_8_ = -dVar9;
    auVar2._0_8_ = -auVar14._0_8_;
    auVar12 = maxpd(auVar14,auVar2);
    if (auVar12._0_8_ <= auVar12._8_8_) {
LAB_001d5ab8:
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
             0xce4,"ref_metric_truncated_cone_dist","div zero forming i and j");
      ref_metric_tattle_truncated_cone_dist(cone_geom,p);
      return 1;
    }
    dVar11 = dVar13;
    if (dVar13 <= -dVar13) {
      dVar11 = -dVar13;
    }
    if (auVar12._0_8_ <= dVar11) goto LAB_001d5ab8;
    dVar11 = dVar15 * (dVar13 / dVar10) - (dVar9 / dVar10) * (dVar5 - dVar16);
    if (0.0 < dVar11) {
      dVar16 = dVar15 * (dVar9 / dVar10) + (dVar13 / dVar10) * (dVar5 - dVar16);
      if (dVar10 <= dVar11) {
        dVar5 = SQRT(dVar16 * dVar16 + (dVar11 - dVar10) * (dVar11 - dVar10));
      }
      else {
        dVar5 = 0.0;
        if (0.0 <= dVar16) {
          dVar5 = dVar16;
        }
      }
      goto LAB_001d59e8;
    }
  }
  else if (dVar10 < dVar16 * dVar16) {
    *dist = -dVar15;
    return 0;
  }
  dVar5 = SQRT((dVar5 - dVar16) * (dVar5 - dVar16) + dVar15 * dVar15);
LAB_001d59e8:
  *dist = dVar5;
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_metric_truncated_cone_dist(REF_DBL *cone_geom,
                                                  REF_DBL *p, REF_DBL *dist) {
  REF_INT d;
  REF_DBL a[3], b[3], ba[3], u[3], pa[3], l, x, y, y2, n, ra, rb, delta, s;
  REF_DBL xprime, yprime;
  REF_BOOL verbose = REF_FALSE;
  if (verbose) printf("\np %f %f %f\n", p[0], p[1], p[2]);
  if (ABS(cone_geom[6]) >= ABS(cone_geom[7])) {
    ra = ABS(cone_geom[6]);
    rb = ABS(cone_geom[7]);
    for (d = 0; d < 3; d++) {
      a[d] = cone_geom[d];
      b[d] = cone_geom[d + 3];
    }
    if (verbose) printf("forward ra %f rb %f\n", ra, rb);
  } else {
    ra = ABS(cone_geom[7]);
    rb = ABS(cone_geom[6]);
    for (d = 0; d < 3; d++) {
      a[d] = cone_geom[d + 3];
      b[d] = cone_geom[d];
    }
    if (verbose) printf("reverse ra %f rb %f\n", ra, rb);
  }
  if (verbose) printf("a %f %f %f\n", a[0], a[1], a[2]);
  if (verbose) printf("b %f %f %f\n", b[0], b[1], b[2]);
  for (d = 0; d < 3; d++) {
    ba[d] = b[d] - a[d];
    u[d] = ba[d];
    pa[d] = p[d] - a[d]; /* direction flip, error in paper? */
  }
  l = sqrt(ref_math_dot(ba, ba));
  if (!ref_math_divisible(u[0], l) || !ref_math_divisible(u[1], l) ||
      !ref_math_divisible(u[2], l)) { /* assume sphere */
    REF_DBL r;
    r = sqrt(pa[0] * pa[0] + pa[1] * pa[1] + pa[2] * pa[2]);
    *dist = MAX(0, r - MAX(ra, rb));
    return REF_SUCCESS;
  }
  RSB(ref_math_normalize(u), "axis length zero",
      { ref_metric_tattle_truncated_cone_dist(cone_geom, p); });
  x = ref_math_dot(pa, u); /* sign flip, error in paper? */
  n = sqrt(ref_math_dot(pa, pa));
  y2 = n * n - x * x;
  if (verbose) printf("n2 %f x2 %f y2 %f\n", n * n, x * x, y2);
  if (y2 <= 0) {
    y = 0;
  } else {
    y = sqrt(y2);
  }
  if (verbose) printf("x %f y %f l %f\n", x, y, l);
  if (x < 0) {
    if (y2 < ra * ra) {
      *dist = -x;
      return REF_SUCCESS;
    } else {
      *dist = sqrt((y - ra) * (y - ra) + x * x);
      return REF_SUCCESS;
    }
  }
  if (y2 < rb * rb) {
    if (x > l) {
      *dist = x - l;
      return REF_SUCCESS;
    } else {
      *dist = 0;
      return REF_SUCCESS;
    }
  }
  delta = ra - rb;
  s = sqrt(l * l + delta * delta);
  RAB(ref_math_divisible(delta, s) && ref_math_divisible(l, s),
      "div zero forming i and j",
      { ref_metric_tattle_truncated_cone_dist(cone_geom, p); });
  if (verbose) printf("l/s %f delta/s %f\n", l / s, delta / s);
  xprime = x * (l / s) - (y - ra) * (delta / s);
  yprime = x * (delta / s) + (y - ra) * (l / s);
  if (verbose) printf("xprime %f yprime %f\n", xprime, yprime);
  if (xprime <= 0) {
    *dist = sqrt((y - ra) * (y - ra) + x * x);
    return REF_SUCCESS;
  }
  if (xprime >= s) {
    *dist = sqrt(yprime * yprime + (xprime - s) * (xprime - s));
    return REF_SUCCESS;
  }
  *dist = MAX(0, yprime);
  return REF_SUCCESS;
}